

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

void xmlRelaxNGCheckGroupAttrs(xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict def)

{
  xmlRelaxNGDefinePtr_conflict pxVar1;
  int iVar2;
  xmlRelaxNGDefinePtr *ppxVar3;
  xmlRelaxNGDefinePtr *ppxVar4;
  undefined8 *puVar5;
  xmlRelaxNGDefinePtr_conflict *ppxVar6;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX_00;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX_01;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX_02;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX_03;
  undefined8 *puVar7;
  long lVar8;
  long lVar9;
  size_t sVar10;
  xmlRelaxNGDefinePtr *ppxVar11;
  long lVar12;
  bool bVar13;
  
  if ((((def->type == XML_RELAXNG_GROUP) || (def->type == XML_RELAXNG_ELEMENT)) &&
      ((def->dflags & 0x20) == 0)) && (ctxt->nbErrors == 0)) {
    sVar10 = 0;
    lVar9 = 0;
    ppxVar11 = &def->attrs;
    for (ppxVar3 = ppxVar11; *ppxVar3 != (xmlRelaxNGDefinePtr)0x0; ppxVar3 = &(*ppxVar3)->next) {
      lVar9 = lVar9 + 1;
      sVar10 = sVar10 + 8;
    }
    ppxVar3 = &def->content;
    for (ppxVar4 = ppxVar3; *ppxVar4 != (xmlRelaxNGDefinePtr)0x0; ppxVar4 = &(*ppxVar4)->next) {
      lVar9 = lVar9 + 1;
      sVar10 = sVar10 + 8;
    }
    puVar5 = (undefined8 *)(*xmlMalloc)(sVar10);
    ppxVar6 = extraout_RDX;
    puVar7 = puVar5;
    if (puVar5 == (undefined8 *)0x0) {
      xmlRngPErrMemory(ctxt,"building group\n");
      return;
    }
    while (pxVar1 = *ppxVar11, pxVar1 != (xmlRelaxNGDefinePtr_conflict)0x0) {
      ppxVar6 = xmlRelaxNGGetElements(ctxt,pxVar1,1);
      *puVar7 = ppxVar6;
      ppxVar6 = extraout_RDX_00;
      puVar7 = puVar7 + 1;
      ppxVar11 = &pxVar1->next;
    }
    while (pxVar1 = *ppxVar3, pxVar1 != (xmlRelaxNGDefinePtr_conflict)0x0) {
      ppxVar6 = xmlRelaxNGGetElements(ctxt,pxVar1,1);
      *puVar7 = ppxVar6;
      puVar7 = puVar7 + 1;
      ppxVar6 = extraout_RDX_01;
      ppxVar3 = &pxVar1->next;
    }
    for (lVar12 = 0; puVar7 = puVar5, lVar9 != lVar12; lVar12 = lVar12 + 1) {
      if (puVar5[lVar12] != 0) {
        for (lVar8 = 0; lVar12 != lVar8; lVar8 = lVar8 + 1) {
          if (((xmlRelaxNGDefinePtr_conflict *)puVar5[lVar8] != (xmlRelaxNGDefinePtr_conflict *)0x0)
             && (iVar2 = xmlRelaxNGCompareElemDefLists
                                   ((xmlRelaxNGParserCtxtPtr)puVar5[lVar12],
                                    (xmlRelaxNGDefinePtr_conflict *)puVar5[lVar8],ppxVar6),
                ppxVar6 = extraout_RDX_02, iVar2 == 0)) {
            xmlRngPErr(ctxt,def->node,0x410,"Attributes conflicts in group\n",(xmlChar *)0x0,
                       (xmlChar *)0x0);
            ppxVar6 = extraout_RDX_03;
          }
        }
      }
    }
    while (bVar13 = lVar9 != 0, lVar9 = lVar9 + -1, bVar13) {
      if ((void *)*puVar7 != (void *)0x0) {
        (*xmlFree)((void *)*puVar7);
      }
      puVar7 = puVar7 + 1;
    }
    (*xmlFree)(puVar5);
    *(byte *)&def->dflags = (byte)def->dflags | 0x20;
  }
  return;
}

Assistant:

static void
xmlRelaxNGCheckGroupAttrs(xmlRelaxNGParserCtxtPtr ctxt,
                          xmlRelaxNGDefinePtr def)
{
    xmlRelaxNGDefinePtr **list;
    xmlRelaxNGDefinePtr cur;
    int nbchild = 0, i, j, ret;

    if ((def == NULL) ||
        ((def->type != XML_RELAXNG_GROUP) &&
         (def->type != XML_RELAXNG_ELEMENT)))
        return;

    if (def->dflags & IS_PROCESSED)
        return;

    /*
     * Don't run that check in case of error. Infinite recursion
     * becomes possible.
     */
    if (ctxt->nbErrors != 0)
        return;

    cur = def->attrs;
    while (cur != NULL) {
        nbchild++;
        cur = cur->next;
    }
    cur = def->content;
    while (cur != NULL) {
        nbchild++;
        cur = cur->next;
    }

    list = (xmlRelaxNGDefinePtr **) xmlMalloc(nbchild *
                                              sizeof(xmlRelaxNGDefinePtr
                                                     *));
    if (list == NULL) {
        xmlRngPErrMemory(ctxt, "building group\n");
        return;
    }
    i = 0;
    cur = def->attrs;
    while (cur != NULL) {
        list[i] = xmlRelaxNGGetElements(ctxt, cur, 1);
        i++;
        cur = cur->next;
    }
    cur = def->content;
    while (cur != NULL) {
        list[i] = xmlRelaxNGGetElements(ctxt, cur, 1);
        i++;
        cur = cur->next;
    }

    for (i = 0; i < nbchild; i++) {
        if (list[i] == NULL)
            continue;
        for (j = 0; j < i; j++) {
            if (list[j] == NULL)
                continue;
            ret = xmlRelaxNGCompareElemDefLists(ctxt, list[i], list[j]);
            if (ret == 0) {
                xmlRngPErr(ctxt, def->node, XML_RNGP_GROUP_ATTR_CONFLICT,
                           "Attributes conflicts in group\n", NULL, NULL);
            }
        }
    }
    for (i = 0; i < nbchild; i++) {
        if (list[i] != NULL)
            xmlFree(list[i]);
    }

    xmlFree(list);
    def->dflags |= IS_PROCESSED;
}